

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

void __thiscall
BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
          (BayesianGameForDecPOMDPStage *this,BayesianGameForDecPOMDPStage *o)

{
  int *piVar1;
  sp_counted_base *psVar2;
  sp_counted_base *psVar3;
  QFunctionJAOHInterface *pQVar4;
  pointer ppJVar5;
  JointBeliefInterface *pJVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  allocator_type local_61;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *local_60;
  BayesianGameIdenticalPayoff *local_58;
  value_type local_50;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> local_48;
  
  (this->super_BayesianGameForDecPOMDPStageInterface)._vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStageInterface_005a16e0;
  (this->super_BayesianGameForDecPOMDPStageInterface)._m_t =
       (o->super_BayesianGameForDecPOMDPStageInterface)._m_t;
  psVar2 = (o->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
  psVar3 = (o->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
  (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px =
       (o->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
  (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_ = psVar3;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (&this->super_BayesianGameIdenticalPayoff,&o->super_BayesianGameIdenticalPayoff);
  (this->super_BayesianGameForDecPOMDPStageInterface)._vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005a1590;
  (this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005a15e0;
  pQVar4 = o->_m_qHeuristic;
  this->_m_pu = o->_m_pu;
  this->_m_qHeuristic = pQVar4;
  local_60 = &this->_m_JBs;
  (this->_m_JBs).super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (this->_m_JBs).super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (this->_m_JBs).super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_areCachedImmediateRewards = o->_m_areCachedImmediateRewards;
  local_58 = &this->super_BayesianGameIdenticalPayoff;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_m_immR,&o->_m_immR);
  local_50 = (value_type)0x0;
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            (&local_48,
             (long)(o->_m_JBs).
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(o->_m_JBs).
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_50,&local_61);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::_M_move_assign
            (local_60,&local_48);
  if (local_48.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ppJVar5 = (o->_m_JBs).
            super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(o->_m_JBs).
                super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppJVar5;
  if (lVar7 != 0) {
    uVar8 = lVar7 >> 3;
    uVar9 = 0;
    uVar10 = 1;
    do {
      if (uVar8 <= uVar9) {
LAB_0037a294:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9
                  );
      }
      if (ppJVar5[uVar9] != (JointBeliefInterface *)0x0) {
        pJVar6 = (JointBeliefInterface *)(**(code **)((long)*ppJVar5[uVar9] + 0xb8))();
        ppJVar5 = (this->_m_JBs).
                  super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->_m_JBs).
                          super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar5 >> 3) <= uVar9)
        goto LAB_0037a294;
        ppJVar5[uVar9] = pJVar6;
      }
      ppJVar5 = (o->_m_JBs).
                super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(o->_m_JBs).
                    super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar5 >> 3;
      bVar11 = uVar8 != uVar10;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar11);
  }
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage(const BayesianGameForDecPOMDPStage& o) 
    :
        BayesianGameForDecPOMDPStageInterface( o ),
        //BayesianGameBase( o ),
        BayesianGameIdenticalPayoff ( o )
        ,_m_pu(o._m_pu)
        ,_m_qHeuristic(o._m_qHeuristic)
        ,_m_areCachedImmediateRewards(o._m_areCachedImmediateRewards)
        ,_m_immR(o._m_immR) //does this work for std::vector< std::vector<double> > ? gues so?
{
    //make deep copy of beliefs in _m_JB
    _m_JBs=std::vector< JointBeliefInterface* >(o._m_JBs.size(),0);
    for(Index k=0;k!=o._m_JBs.size();++k)
    {
        if(o._m_JBs.at(k))
            _m_JBs.at(k)=o._m_JBs.at(k)->Clone();
    }
}